

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3SqlExec(int *pRC,Fts3Table *p,int eStmt,sqlite3_value **apVal)

{
  sqlite3_stmt *pStmt;
  int iVar1;
  long in_FS_OFFSET;
  sqlite3_stmt *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*pRC == 0) {
    local_20 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
    iVar1 = fts3SqlStmt(p,eStmt,&local_20,apVal);
    pStmt = local_20;
    if (iVar1 == 0) {
      sqlite3_step(local_20);
      iVar1 = sqlite3_reset(pStmt);
    }
    *pRC = iVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts3SqlExec(
  int *pRC,                /* Result code */
  Fts3Table *p,            /* The FTS3 table */
  int eStmt,               /* Index of statement to evaluate */
  sqlite3_value **apVal    /* Parameters to bind */
){
  sqlite3_stmt *pStmt;
  int rc;
  if( *pRC ) return;
  rc = fts3SqlStmt(p, eStmt, &pStmt, apVal);
  if( rc==SQLITE_OK ){
    sqlite3_step(pStmt);
    rc = sqlite3_reset(pStmt);
  }
  *pRC = rc;
}